

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isofile_gen_utility_names(archive_write *a,isofile *file)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  size_t s;
  wchar_t wVar4;
  mode_t mVar5;
  char *pcVar6;
  int *piVar7;
  archive_string_conv *paVar8;
  archive_string *paVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  size_t n;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  char *u16;
  int local_4c;
  ulong local_48;
  char *local_40;
  archive_string *local_38;
  
  pvVar2 = a->format_data;
  (file->parentdir).length = 0;
  (file->basename).length = 0;
  (file->basename_utf16).length = 0;
  (file->symlink).length = 0;
  pcVar6 = archive_entry_pathname(file->entry);
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
    file->dircnt = 0;
    return 0;
  }
  if ((*(byte *)((long)pvVar2 + 0x10372) & 6) == 0) {
    local_4c = 0;
    goto LAB_001735f9;
  }
  if (*(long *)((long)pvVar2 + 0x78) == 0) {
    paVar8 = archive_string_conversion_to_charset(&a->archive,"UTF-16BE",L'\x01');
    *(archive_string_conv **)((long)pvVar2 + 0x78) = paVar8;
    if (paVar8 != (archive_string_conv *)0x0) {
      paVar8 = archive_string_conversion_from_charset(&a->archive,"UTF-16BE",L'\x01');
      *(archive_string_conv **)((long)pvVar2 + 0x80) = paVar8;
      if (paVar8 != (archive_string_conv *)0x0) goto LAB_0017345b;
    }
LAB_0017350f:
    local_4c = 0;
    bVar16 = false;
  }
  else {
LAB_0017345b:
    wVar4 = _archive_entry_pathname_l
                      (file->entry,&local_40,&local_48,
                       *(archive_string_conv **)((long)pvVar2 + 0x78));
    local_4c = 0;
    if (wVar4 < L'\0') {
      piVar7 = __errno_location();
      if (*piVar7 == 0xc) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for UTF-16BE");
        goto LAB_0017350f;
      }
      archive_set_error(&a->archive,-1,
                        "A filename cannot be converted to UTF-16BE;You should disable making Joliet extension"
                       );
      local_4c = -0x14;
    }
    for (; ((1 < local_48 && (local_40[local_48 - 2] == '\0')) && (local_40[local_48 - 1] == '/'));
        local_48 = local_48 - 2) {
    }
    uVar14 = local_48 >> 1;
    bVar16 = 1 < local_48;
    pcVar15 = local_40;
    local_48 = uVar14;
    pcVar3 = local_40;
    pcVar13 = local_40;
    if (bVar16) {
      do {
        pcVar13 = pcVar3 + 2;
        local_48 = local_48 - 1;
        pcVar15 = local_40;
        if ((*pcVar3 == '\0') && (pcVar3[1] == '/')) {
          pcVar15 = pcVar13;
          uVar14 = local_48;
        }
        local_40 = pcVar15;
        pcVar3 = pcVar13;
      } while (local_48 != 0);
    }
    local_40 = pcVar13;
    s = uVar14 * 2;
    paVar9 = archive_string_ensure(&file->basename_utf16,s);
    if (paVar9 == (archive_string *)0x0) {
      bVar16 = false;
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for UTF-16BE");
    }
    else {
      memcpy((file->basename_utf16).s,pcVar15,s);
      (file->basename_utf16).length = s;
      bVar16 = true;
    }
  }
  if (!bVar16) {
    return -0x1e;
  }
LAB_001735f9:
  local_38 = &file->symlink;
  (file->parentdir).length = 0;
  sVar10 = strlen(pcVar6);
  archive_strncat(&file->parentdir,pcVar6,sVar10);
  pcVar3 = (file->parentdir).s;
  uVar14 = (file->parentdir).length;
  pcVar6 = pcVar3;
  do {
    if (*pcVar6 == '.') {
      pcVar15 = pcVar6 + 1;
      cVar1 = pcVar6[1];
      lVar11 = -1;
      if (cVar1 != '\0') {
        if (cVar1 != '/') {
          if (cVar1 != '.') break;
          if (pcVar6[2] == '/') {
            pcVar15 = pcVar6 + 3;
            lVar11 = -3;
            goto LAB_001736ad;
          }
          if (pcVar6[2] != '\0') break;
        }
        pcVar15 = pcVar6 + 2;
        lVar11 = -2;
      }
    }
    else {
      if (*pcVar6 != '/') break;
      pcVar15 = pcVar6 + 1;
      lVar11 = -1;
    }
LAB_001736ad:
    uVar14 = uVar14 + lVar11;
    pcVar6 = pcVar15;
  } while( true );
  if (pcVar6 != pcVar3) {
    memmove(pcVar3,pcVar6,uVar14 + 1);
    pcVar6 = pcVar3;
  }
  do {
    if (uVar14 == 0) break;
    uVar12 = uVar14;
    if (pcVar6[uVar14 - 1] == '/') {
      uVar12 = uVar14 - 1;
      pcVar6[uVar12] = '\0';
    }
    if (((1 < uVar12) && (pcVar6[uVar12 - 2] == '/')) && (pcVar6[uVar12 - 1] == '.')) {
      uVar12 = uVar12 - 2;
      pcVar6[uVar12] = '\0';
    }
    if ((((2 < uVar12) && (pcVar6[uVar12 - 3] == '/')) && (pcVar6[uVar12 - 2] == '.')) &&
       (pcVar6[uVar12 - 1] == '.')) {
      uVar12 = uVar12 - 3;
      pcVar6[uVar12] = '\0';
    }
    bVar16 = uVar14 != uVar12;
    uVar14 = uVar12;
  } while (bVar16);
LAB_001737d1:
  do {
    while (pcVar15 = pcVar6, *pcVar15 != '/') {
      if (*pcVar15 == '\0') {
        sVar10 = strlen(pcVar3);
        mVar5 = archive_entry_filetype(file->entry);
        if (mVar5 == 0xa000) {
          pcVar6 = archive_entry_symlink(file->entry);
          (file->symlink).length = 0;
          if (pcVar6 == (char *)0x0) {
            n = 0;
          }
          else {
            n = strlen(pcVar6);
          }
          archive_strncat(local_38,pcVar6,n);
        }
        file->dircnt = 0;
        pcVar15 = (char *)0x0;
        pcVar6 = pcVar3;
        do {
          if (*pcVar6 == '/') {
            file->dircnt = file->dircnt + 1;
            pcVar15 = pcVar6;
          }
          else if (*pcVar6 == '\0') {
            if (pcVar15 == (char *)0x0) {
              (file->parentdir).length = sVar10;
              (file->basename).length = 0;
              archive_string_concat(&file->basename,&file->parentdir);
              (file->parentdir).length = 0;
              *(file->parentdir).s = '\0';
              return local_4c;
            }
            *pcVar15 = '\0';
            (file->parentdir).length = (long)pcVar15 - (long)pcVar3;
            (file->basename).length = 0;
            sVar10 = strlen(pcVar15 + 1);
            archive_strncat(&file->basename,pcVar15 + 1,sVar10);
            mVar5 = archive_entry_filetype(file->entry);
            if (mVar5 != 0x4000) {
              return local_4c;
            }
            file->dircnt = file->dircnt + 1;
            return local_4c;
          }
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
      pcVar6 = pcVar15 + 1;
    }
    pcVar6 = pcVar15 + 1;
    if (pcVar15[1] != '.') {
      if (pcVar15[1] == '/') {
LAB_00173768:
        sVar10 = strlen(pcVar6);
        memmove(pcVar15,pcVar6,sVar10 + 1);
        pcVar6 = pcVar15;
      }
      goto LAB_001737d1;
    }
    if (pcVar15[2] == '/') {
      pcVar6 = pcVar15 + 2;
      goto LAB_00173768;
    }
    if ((pcVar15[2] == '.') && (pcVar15[3] == '/')) {
      pcVar6 = pcVar15;
      do {
        pcVar6 = pcVar6 + -1;
        if (pcVar6 < pcVar3) break;
      } while (*pcVar6 != '/');
      if (pcVar3 < pcVar6) {
        strcpy(pcVar6,pcVar15 + 3);
      }
      else {
        strcpy(pcVar3,pcVar15 + 4);
        pcVar6 = pcVar3;
      }
    }
  } while( true );
}

Assistant:

static int
isofile_gen_utility_names(struct archive_write *a, struct isofile *file)
{
	struct iso9660 *iso9660;
	const char *pathname;
	char *p, *dirname, *slash;
	size_t len;
	int ret = ARCHIVE_OK;

	iso9660 = a->format_data;

	archive_string_empty(&(file->parentdir));
	archive_string_empty(&(file->basename));
	archive_string_empty(&(file->basename_utf16));
	archive_string_empty(&(file->symlink));

	pathname =  archive_entry_pathname(file->entry);
	if (pathname == NULL || pathname[0] == '\0') {/* virtual root */
		file->dircnt = 0;
		return (ret);
	}

	/*
	 * Make a UTF-16BE basename if Joliet extension enabled.
	 */
	if (iso9660->opt.joliet) {
		const char *u16, *ulast;
		size_t u16len, ulen_last;

		if (iso9660->sconv_to_utf16be == NULL) {
			iso9660->sconv_to_utf16be =
			    archive_string_conversion_to_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_to_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
			iso9660->sconv_from_utf16be =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_from_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
		}

		/*
		 * Convert a filename to UTF-16BE.
		 */
		if (0 > archive_entry_pathname_l(file->entry, &u16, &u16len,
		    iso9660->sconv_to_utf16be)) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for UTF-16BE");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "A filename cannot be converted to UTF-16BE;"
			    "You should disable making Joliet extension");
			ret = ARCHIVE_WARN;
		}

		/*
		 * Make sure a path separator is not in the last;
		 * Remove trailing '/'.
		 */
		while (u16len >= 2) {
#if defined(_WIN32) || defined(__CYGWIN__)
			if (u16[u16len-2] == 0 &&
			    (u16[u16len-1] == '/' || u16[u16len-1] == '\\'))
#else
			if (u16[u16len-2] == 0 && u16[u16len-1] == '/')
#endif
			{
				u16len -= 2;
			} else
				break;
		}

		/*
		 * Find a basename in UTF-16BE.
		 */
		ulast = u16;
		u16len >>= 1;
		ulen_last = u16len;
		while (u16len > 0) {
#if defined(_WIN32) || defined(__CYGWIN__)
			if (u16[0] == 0 && (u16[1] == '/' || u16[1] == '\\'))
#else
			if (u16[0] == 0 && u16[1] == '/')
#endif
			{
				ulast = u16 + 2;
				ulen_last = u16len -1;
			}
			u16 += 2;
			u16len --;
		}
		ulen_last <<= 1;
		if (archive_string_ensure(&(file->basename_utf16),
		    ulen_last) == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}

		/*
		 * Set UTF-16BE basename.
		 */
		memcpy(file->basename_utf16.s, ulast, ulen_last);
		file->basename_utf16.length = ulen_last;
	}

	archive_strcpy(&(file->parentdir), pathname);
#if defined(_WIN32) || defined(__CYGWIN__)
	/*
	 * Convert a path-separator from '\' to  '/'
	 */
	if (cleanup_backslash_1(file->parentdir.s) != 0) {
		const wchar_t *wp = archive_entry_pathname_w(file->entry);
		struct archive_wstring ws;

		if (wp != NULL) {
			int r;
			archive_string_init(&ws);
			archive_wstrcpy(&ws, wp);
			cleanup_backslash_2(ws.s);
			archive_string_empty(&(file->parentdir));
			r = archive_string_append_from_wcs(&(file->parentdir),
			    ws.s, ws.length);
			archive_wstring_free(&ws);
			if (r < 0 && errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				return (ARCHIVE_FATAL);
			}
		}
	}
#endif

	len = file->parentdir.length;
	p = dirname = file->parentdir.s;

	/*
	 * Remove leading '/', '../' and './' elements
	 */
	while (*p) {
		if (p[0] == '/') {
			p++;
			len--;
		} else if (p[0] != '.')
			break;
		else if (p[1] == '.' && p[2] == '/') {
			p += 3;
			len -= 3;
		} else if (p[1] == '/' || (p[1] == '.' && p[2] == '\0')) {
			p += 2;
			len -= 2;
		} else if (p[1] == '\0') {
			p++;
			len--;
		} else
			break;
	}
	if (p != dirname) {
		memmove(dirname, p, len+1);
		p = dirname;
	}
	/*
	 * Remove "/","/." and "/.." elements from tail.
	 */
	while (len > 0) {
		size_t ll = len;

		if (len > 0 && p[len-1] == '/') {
			p[len-1] = '\0';
			len--;
		}
		if (len > 1 && p[len-2] == '/' && p[len-1] == '.') {
			p[len-2] = '\0';
			len -= 2;
		}
		if (len > 2 && p[len-3] == '/' && p[len-2] == '.' &&
		    p[len-1] == '.') {
			p[len-3] = '\0';
			len -= 3;
		}
		if (ll == len)
			break;
	}
	while (*p) {
		if (p[0] == '/') {
			if (p[1] == '/')
				/* Convert '//' --> '/' */
				memmove(p, p+1, strlen(p+1) + 1);
			else if (p[1] == '.' && p[2] == '/')
				/* Convert '/./' --> '/' */
				memmove(p, p+2, strlen(p+2) + 1);
			else if (p[1] == '.' && p[2] == '.' && p[3] == '/') {
				/* Convert 'dir/dir1/../dir2/'
				 *     --> 'dir/dir2/'
				 */
				char *rp = p -1;
				while (rp >= dirname) {
					if (*rp == '/')
						break;
					--rp;
				}
				if (rp > dirname) {
					strcpy(rp, p+3);
					p = rp;
				} else {
					strcpy(dirname, p+4);
					p = dirname;
				}
			} else
				p++;
		} else
			p++;
	}
	p = dirname;
	len = strlen(p);

	if (archive_entry_filetype(file->entry) == AE_IFLNK) {
		/* Convert symlink name too. */
		pathname = archive_entry_symlink(file->entry);
		archive_strcpy(&(file->symlink),  pathname);
#if defined(_WIN32) || defined(__CYGWIN__)
		/*
		 * Convert a path-separator from '\' to  '/'
		 */
		if (archive_strlen(&(file->symlink)) > 0 &&
		    cleanup_backslash_1(file->symlink.s) != 0) {
			const wchar_t *wp =
			    archive_entry_symlink_w(file->entry);
			struct archive_wstring ws;

			if (wp != NULL) {
				int r;
				archive_string_init(&ws);
				archive_wstrcpy(&ws, wp);
				cleanup_backslash_2(ws.s);
				archive_string_empty(&(file->symlink));
				r = archive_string_append_from_wcs(
				    &(file->symlink),
				    ws.s, ws.length);
				archive_wstring_free(&ws);
				if (r < 0 && errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory");
					return (ARCHIVE_FATAL);
				}
			}
		}
#endif
	}
	/*
	 * - Count up directory elements.
	 * - Find out the position which points the last position of
	 *   path separator('/').
	 */
	slash = NULL;
	file->dircnt = 0;
	for (; *p != '\0'; p++)
		if (*p == '/') {
			slash = p;
			file->dircnt++;
		}
	if (slash == NULL) {
		/* The pathname doesn't have a parent directory. */
		file->parentdir.length = len;
		archive_string_copy(&(file->basename), &(file->parentdir));
		archive_string_empty(&(file->parentdir));
		*file->parentdir.s = '\0';
		return (ret);
	}

	/* Make a basename from dirname and slash */
	*slash  = '\0';
	file->parentdir.length = slash - dirname;
	archive_strcpy(&(file->basename),  slash + 1);
	if (archive_entry_filetype(file->entry) == AE_IFDIR)
		file->dircnt ++;
	return (ret);
}